

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

void __thiscall DROPlayer::DROPlayer(DROPlayer *this)

{
  PlayerBase::PlayerBase(&this->super_PlayerBase);
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__DROPlayer_00191bf0;
  (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_devCfgs).
  super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devCfgs).
  super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devCfgs).
  super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_tickFreq = 1000;
  (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_initRegSet).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->_devices).
  super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devices).
  super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devices).
  super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_devNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_devNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_devNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_filePos = 0;
  this->_fileTick = 0;
  this->_playTick = 0;
  this->_playSmpl = 0;
  this->_playState = '\0';
  this->_psTrigger = '\0';
  (this->_logger).func = PlayerLogCB;
  (this->_logger).source = this;
  (this->_logger).param = (void *)0x0;
  (this->_playOpts).genOpts.pbSpeed = 0x10000;
  (this->_playOpts).v2opl3Mode = '\0';
  this->_lastTsMult = 0;
  this->_lastTsDiv = 0;
  PlayerBase::InitDeviceOptions(this->_devOpts);
  PlayerBase::InitDeviceOptions(this->_devOpts + 1);
  PlayerBase::InitDeviceOptions(this->_devOpts + 2);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->_initRegSet,0x200,false);
  return;
}

Assistant:

DROPlayer::DROPlayer() :
	_tickFreq(1000),
	_filePos(0),
	_fileTick(0),
	_playTick(0),
	_playSmpl(0),
	_playState(0x00),
	_psTrigger(0x00)
{
	size_t curDev;
	
	dev_logger_set(&_logger, this, DROPlayer::PlayerLogCB, NULL);
	
	_playOpts.genOpts.pbSpeed = 0x10000;
	_playOpts.v2opl3Mode = DRO_V2OPL3_DETECT;
	
	_lastTsMult = 0;
	_lastTsDiv = 0;
	
	for (curDev = 0; curDev < 3; curDev ++)
		InitDeviceOptions(_devOpts[curDev]);
	_initRegSet.resize(0x200, false);
}